

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

int32_t ucol_nextSortKeyPart_63
                  (UCollator *coll,UCharIterator *iter,uint32_t *state,uint8_t *dest,int32_t count,
                  UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  Collator *pCVar3;
  int32_t i;
  UErrorCode *status_local;
  int32_t count_local;
  uint8_t *dest_local;
  uint32_t *state_local;
  UCharIterator *iter_local;
  UCollator *coll_local;
  
  if ((status != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    pCVar3 = icu_63::Collator::fromUCollator(coll);
    iVar2 = (*(pCVar3->super_UObject)._vptr_UObject[0x26])
                      (pCVar3,iter,state,dest,(ulong)(uint)count,status);
    return iVar2;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_nextSortKeyPart(const UCollator *coll,
                     UCharIterator *iter,
                     uint32_t state[2],
                     uint8_t *dest, int32_t count,
                     UErrorCode *status)
{
    /* error checking */
    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }
    UTRACE_ENTRY(UTRACE_UCOL_NEXTSORTKEYPART);
    UTRACE_DATA6(UTRACE_VERBOSE, "coll=%p, iter=%p, state=%d %d, dest=%p, count=%d",
                  coll, iter, state[0], state[1], dest, count);

    int32_t i = Collator::fromUCollator(coll)->
            internalNextSortKeyPart(iter, state, dest, count, *status);

    // Return number of meaningful sortkey bytes.
    UTRACE_DATA4(UTRACE_VERBOSE, "dest = %vb, state=%d %d",
                  dest,i, state[0], state[1]);
    UTRACE_EXIT_VALUE_STATUS(i, *status);
    return i;
}